

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O3

int pkcs12_key_gen(char *pass,size_t pass_len,uint8_t *salt,size_t salt_len,uint8_t id,
                  uint32_t iterations,size_t out_len,uint8_t *out,EVP_MD *md)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  size_t __n;
  ulong uVar4;
  void *d;
  void *pvVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t pass_raw_len;
  uint8_t *pass_raw;
  EVP_MD_CTX ctx;
  uint8_t A [64];
  uint8_t D [128];
  CBS cbs;
  uint local_1d4;
  uint8_t *local_1d0;
  ulong local_1c8;
  size_t local_1c0;
  size_t local_1b8;
  uint8_t *local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  EVP_MD_CTX local_198 [2];
  CBB local_138 [2];
  CBS local_b8 [8];
  undefined4 extraout_var;
  
  if (iterations == 0) {
    ERR_put_error(0x13,0,0x81,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,0x44);
    return 0;
  }
  EVP_MD_CTX_init(local_198);
  local_1b0 = (uint8_t *)0x0;
  local_1b8 = 0;
  if (pass == (char *)0x0) {
LAB_002140d6:
    iVar1 = EVP_MD_block_size((EVP_MD *)md);
    __n = CONCAT44(extraout_var,iVar1);
    if (__n != 0) {
      memset(local_138,(uint)id,__n);
    }
    uVar10 = (salt_len + __n) - 1;
    if (uVar10 < salt_len) {
LAB_0021411e:
      iVar1 = 0x6a;
    }
    else {
      uVar6 = __n - 1;
      puVar7 = (uint8_t *)(local_1b8 + uVar6);
      if (CARRY8(local_1b8,uVar6)) goto LAB_0021411e;
      uVar9 = uVar10 - uVar10 % __n;
      uVar4 = (long)puVar7 - (long)((ulong)puVar7 % __n);
      if (!CARRY8(uVar4,uVar9)) {
        local_1d0 = (uint8_t *)((ulong)puVar7 % __n);
        local_1c8 = uVar4;
        local_1c0 = uVar4 + uVar9;
        local_1a8 = uVar6;
        local_1a0 = uVar10 % __n;
        d = OPENSSL_malloc(uVar4 + uVar9);
        if (local_1c0 != 0 && d == (void *)0x0) goto LAB_0021418e;
        if (uVar10 != local_1a0) {
          uVar10 = 0;
          do {
            *(uint8_t *)((long)d + uVar10) = salt[uVar10 % salt_len];
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar9);
        }
        if (puVar7 != local_1d0) {
          uVar10 = 0;
          do {
            *(uint8_t *)((long)d + uVar10 + uVar9) = local_1b0[uVar10 % local_1b8];
            uVar10 = uVar10 + 1;
          } while (uVar10 < local_1c8);
        }
        if (out_len == 0) {
LAB_00214494:
          iVar1 = 1;
          goto LAB_00214193;
        }
        uVar2 = 2;
        if (2 < iterations) {
          uVar2 = iterations;
        }
        local_1c8 = CONCAT44(local_1c8._4_4_,uVar2);
        iVar1 = EVP_DigestInit_ex(local_198,(EVP_MD *)md,(ENGINE *)0x0);
        if (iVar1 != 0) {
          local_1d0 = out;
          local_1c8 = CONCAT44(local_1c8._4_4_,(int)local_1c8 + -1);
          do {
            iVar1 = EVP_DigestUpdate(local_198,local_138,__n);
            if (((iVar1 == 0) || (iVar1 = EVP_DigestUpdate(local_198,d,local_1c0), iVar1 == 0)) ||
               (iVar1 = EVP_DigestFinal_ex(local_198,(uchar *)&local_198[0].pctx,&local_1d4),
               iVar1 == 0)) break;
            iVar1 = (int)local_1c8;
            if (iterations != 1) {
              do {
                iVar3 = EVP_DigestInit_ex(local_198,(EVP_MD *)md,(ENGINE *)0x0);
                if (((iVar3 == 0) ||
                    (iVar3 = EVP_DigestUpdate(local_198,&local_198[0].pctx,(ulong)local_1d4),
                    iVar3 == 0)) ||
                   (iVar3 = EVP_DigestFinal_ex(local_198,(uchar *)&local_198[0].pctx,&local_1d4),
                   iVar3 == 0)) goto LAB_00214190;
                iVar1 = iVar1 + -1;
              } while (iVar1 != 0);
            }
            uVar6 = (ulong)local_1d4;
            uVar10 = uVar6;
            if (out_len < uVar6) {
              uVar10 = out_len;
            }
            if (uVar6 != 0) {
              memcpy(local_1d0,&local_198[0].pctx,uVar10);
            }
            out_len = out_len - uVar10;
            if (out_len == 0) goto LAB_00214494;
            local_1d0 = local_1d0 + uVar10;
            uVar10 = 0;
            do {
              *(undefined1 *)((long)&local_b8[0].data + uVar10) =
                   *(undefined1 *)((long)&local_198[0].pctx + uVar10 % uVar6);
              uVar10 = uVar10 + 1;
            } while (__n + (__n == 0) != uVar10);
            if (local_1c0 % __n != 0) {
              __assert_fail("I_len % block_size == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                            ,0xa6,
                            "int pkcs12_key_gen(const char *, size_t, const uint8_t *, size_t, uint8_t, uint32_t, size_t, uint8_t *, const EVP_MD *)"
                           );
            }
            if (local_1c0 != 0) {
              uVar10 = 0;
              pvVar5 = d;
              do {
                uVar8 = 1;
                uVar6 = local_1a8;
                do {
                  uVar8 = (uint)*(byte *)((long)&local_b8[0].data + uVar6) +
                          *(byte *)((long)pvVar5 + uVar6) + uVar8;
                  *(char *)((long)pvVar5 + uVar6) = (char)uVar8;
                  uVar8 = uVar8 >> 8;
                  uVar6 = uVar6 - 1;
                } while (uVar6 < __n);
                uVar10 = uVar10 + __n;
                pvVar5 = (void *)((long)pvVar5 + __n);
              } while (uVar10 < local_1c0);
            }
            iVar1 = EVP_DigestInit_ex(local_198,(EVP_MD *)md,(ENGINE *)0x0);
          } while (iVar1 != 0);
        }
        goto LAB_00214190;
      }
      iVar1 = 0x71;
    }
    d = (void *)0x0;
    ERR_put_error(0x13,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,iVar1);
  }
  else {
    CBB_zero(local_138);
    iVar1 = CBB_init(local_138,pass_len * 2);
    if (iVar1 == 0) {
LAB_00214181:
      CBB_cleanup(local_138);
    }
    else {
      local_b8[0].data = (uint8_t *)pass;
      local_b8[0].len = pass_len;
      if (pass_len != 0) {
        do {
          iVar1 = CBS_get_utf8(local_b8,(uint32_t *)&local_198[0].pctx);
          if ((iVar1 == 0) ||
             (iVar1 = CBB_add_ucs2_be(local_138,(uint32_t)local_198[0].pctx), iVar1 == 0)) {
            ERR_put_error(0x13,0,0x83,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                          ,0x30);
            goto LAB_00214181;
          }
        } while (local_b8[0].len != 0);
      }
      iVar1 = CBB_add_ucs2_be(local_138,0);
      if (iVar1 == 0) goto LAB_00214181;
      iVar1 = CBB_finish(local_138,&local_1b0,&local_1b8);
      CBB_cleanup(local_138);
      if (iVar1 != 0) goto LAB_002140d6;
    }
LAB_0021418e:
    d = (void *)0x0;
  }
LAB_00214190:
  iVar1 = 0;
LAB_00214193:
  OPENSSL_free(d);
  OPENSSL_free(local_1b0);
  EVP_MD_CTX_cleanup(local_198);
  return iVar1;
}

Assistant:

int pkcs12_key_gen(const char *pass, size_t pass_len, const uint8_t *salt,
                   size_t salt_len, uint8_t id, uint32_t iterations,
                   size_t out_len, uint8_t *out, const EVP_MD *md) {
  // See https://tools.ietf.org/html/rfc7292#appendix-B. Quoted parts of the
  // specification have errata applied and other typos fixed.

  if (iterations < 1) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_ITERATION_COUNT);
    return 0;
  }

  int ret = 0;
  EVP_MD_CTX ctx;
  EVP_MD_CTX_init(&ctx);
  uint8_t *pass_raw = NULL, *I = NULL;
  size_t pass_raw_len = 0, I_len = 0;

  {
    // If |pass| is NULL, we use the empty string rather than {0, 0} as the raw
    // password.
    if (pass != NULL &&
        !pkcs12_encode_password(pass, pass_len, &pass_raw, &pass_raw_len)) {
      goto err;
    }

    // In the spec, |block_size| is called "v", but measured in bits.
    size_t block_size = EVP_MD_block_size(md);

    // 1. Construct a string, D (the "diversifier"), by concatenating v/8 copies
    // of ID.
    uint8_t D[EVP_MAX_MD_BLOCK_SIZE];
    OPENSSL_memset(D, id, block_size);

    // 2. Concatenate copies of the salt together to create a string S of length
    // v(ceiling(s/v)) bits (the final copy of the salt may be truncated to
    // create S). Note that if the salt is the empty string, then so is S.
    //
    // 3. Concatenate copies of the password together to create a string P of
    // length v(ceiling(p/v)) bits (the final copy of the password may be
    // truncated to create P).  Note that if the password is the empty string,
    // then so is P.
    //
    // 4. Set I=S||P to be the concatenation of S and P.
    if (salt_len + block_size - 1 < salt_len ||
        pass_raw_len + block_size - 1 < pass_raw_len) {
      OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
      goto err;
    }
    size_t S_len = block_size * ((salt_len + block_size - 1) / block_size);
    size_t P_len = block_size * ((pass_raw_len + block_size - 1) / block_size);
    I_len = S_len + P_len;
    if (I_len < S_len) {
      OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
      goto err;
    }

    I = reinterpret_cast<uint8_t *>(OPENSSL_malloc(I_len));
    if (I_len != 0 && I == NULL) {
      goto err;
    }

    for (size_t i = 0; i < S_len; i++) {
      I[i] = salt[i % salt_len];
    }
    for (size_t i = 0; i < P_len; i++) {
      I[i + S_len] = pass_raw[i % pass_raw_len];
    }

    while (out_len != 0) {
      // A. Set A_i=H^r(D||I). (i.e., the r-th hash of D||I,
      // H(H(H(... H(D||I))))
      uint8_t A[EVP_MAX_MD_SIZE];
      unsigned A_len;
      if (!EVP_DigestInit_ex(&ctx, md, NULL) ||
          !EVP_DigestUpdate(&ctx, D, block_size) ||
          !EVP_DigestUpdate(&ctx, I, I_len) ||
          !EVP_DigestFinal_ex(&ctx, A, &A_len)) {
        goto err;
      }
      for (uint32_t iter = 1; iter < iterations; iter++) {
        if (!EVP_DigestInit_ex(&ctx, md, NULL) ||
            !EVP_DigestUpdate(&ctx, A, A_len) ||
            !EVP_DigestFinal_ex(&ctx, A, &A_len)) {
          goto err;
        }
      }

      size_t todo = out_len < A_len ? out_len : A_len;
      OPENSSL_memcpy(out, A, todo);
      out += todo;
      out_len -= todo;
      if (out_len == 0) {
        break;
      }

      // B. Concatenate copies of A_i to create a string B of length v bits (the
      // final copy of A_i may be truncated to create B).
      uint8_t B[EVP_MAX_MD_BLOCK_SIZE];
      for (size_t i = 0; i < block_size; i++) {
        B[i] = A[i % A_len];
      }

      // C. Treating I as a concatenation I_0, I_1, ..., I_(k-1) of v-bit
      // blocks, where k=ceiling(s/v)+ceiling(p/v), modify I by setting
      // I_j=(I_j+B+1) mod 2^v for each j.
      assert(I_len % block_size == 0);
      for (size_t i = 0; i < I_len; i += block_size) {
        unsigned carry = 1;
        for (size_t j = block_size - 1; j < block_size; j--) {
          carry += I[i + j] + B[j];
          I[i + j] = (uint8_t)carry;
          carry >>= 8;
        }
      }
    }

    ret = 1;
  }

err:
  OPENSSL_free(I);
  OPENSSL_free(pass_raw);
  EVP_MD_CTX_cleanup(&ctx);
  return ret;
}